

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::TestOpening(ColladaParser *this,char *pName)

{
  int iVar1;
  undefined4 extraout_var;
  string local_1b0;
  ostringstream local_190 [376];
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"Unexpected end of file while beginning of <");
    std::operator<<((ostream *)local_190,pName);
    std::operator<<((ostream *)local_190,"> element.");
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_1b0);
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 3) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"Unexpected end of file while reading beginning of <");
      std::operator<<((ostream *)local_190,pName);
      std::operator<<((ostream *)local_190,"> element.");
      std::__cxx11::stringbuf::str();
      ThrowException(this,&local_1b0);
    }
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 1) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),pName);
    if (iVar1 == 0) {
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"Expected start of <");
  std::operator<<((ostream *)local_190,pName);
  std::operator<<((ostream *)local_190,"> element.");
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1b0);
}

Assistant:

void ColladaParser::TestOpening(const char* pName) {
    // read element start
    if (!mReader->read()) {
        ThrowException(format() << "Unexpected end of file while beginning of <" << pName << "> element.");
    }
    // whitespace in front is ok, just read again if found
    if (mReader->getNodeType() == irr::io::EXN_TEXT) {
        if (!mReader->read()) {
            ThrowException(format() << "Unexpected end of file while reading beginning of <" << pName << "> element.");
        }
    }

    if (mReader->getNodeType() != irr::io::EXN_ELEMENT || strcmp(mReader->getNodeName(), pName) != 0) {
        ThrowException(format() << "Expected start of <" << pName << "> element.");
    }
}